

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O3

void anon_unknown.dwarf_2eb133::writeReadYa
               (Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
               _func_void_Array2D<Imf_2_5::Rgba>_ptr_int_int *fillPixels)

{
  ulong yStride;
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  half *phVar5;
  undefined4 in_register_00000014;
  long lVar6;
  undefined4 in_register_00000034;
  char *name;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  Array2D<Imf_2_5::Rgba> pixels1;
  TiledRgbaOutputFile out;
  V2f local_38;
  
  name = (char *)CONCAT44(in_register_00000034,tileSizeX);
  lVar6 = (long)(dw->max).x - (long)(dw->min).x;
  yStride = lVar6 + 1;
  iVar1 = (dw->max).y - (dw->min).y;
  uVar9 = iVar1 + 1;
  pixels1._sizeX = (long)(int)uVar9;
  uVar10 = -(ulong)(pixels1._sizeX * yStride >> 0x3d != 0) | pixels1._sizeX * yStride * 8;
  pixels1._sizeY = yStride;
  pixels1._data = (Rgba *)operator_new__(uVar10);
  pvVar4 = operator_new__(uVar10);
  (*(code *)CONCAT44(in_register_00000014,tileSizeY))(&pixels1,yStride & 0xffffffff,uVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  local_38.x = 0.0;
  local_38.y = 0.0;
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,name,0x13,0x1b,ONE_LEVEL,ROUND_DOWN,dw,dw,WRITE_YA,1.0,&local_38,1.0,INCREASING_Y,
             ZIP_COMPRESSION,iVar2);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
            (&out,pixels1._data + (-(long)(dw->min).y * pixels1._sizeY - (long)(dw->min).x),1,
             yStride);
  iVar2 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0);
  iVar3 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles(&out,0,iVar2 + -1,0,iVar3 + -1,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,name,iVar2);
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            ((TiledRgbaInputFile *)&out,
             (Rgba *)((long)pvVar4 + (long)(dw->min).x * -8 + -(long)(dw->min).y * yStride * 8),1,
             yStride);
  iVar2 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&out,0);
  iVar3 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&out,0);
  Imf_2_5::TiledRgbaInputFile::readTiles((TiledRgbaInputFile *)&out,0,iVar2 + -1,0,iVar3 + -1,0);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (-1 < iVar1) {
    lVar7 = (long)pvVar4 + 6;
    phVar5 = &(pixels1._data)->a;
    uVar10 = 0;
    do {
      if (-1 < (int)lVar6) {
        uVar8 = 0;
        do {
          if ((half::_toFloat[phVar5[uVar8 * 4 + -3]._h].f !=
               half::_toFloat[*(ushort *)(lVar7 + -6 + uVar8 * 8)].f) ||
             (NAN(half::_toFloat[phVar5[uVar8 * 4 + -3]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(lVar7 + -6 + uVar8 * 8)].f))) {
            __assert_fail("p1.r == p2.r",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                          ,0xa4,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          if ((half::_toFloat[phVar5[uVar8 * 4 + -2]._h].f !=
               half::_toFloat[*(ushort *)(lVar7 + -4 + uVar8 * 8)].f) ||
             (NAN(half::_toFloat[phVar5[uVar8 * 4 + -2]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(lVar7 + -4 + uVar8 * 8)].f))) {
            __assert_fail("p1.g == p2.g",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                          ,0xa5,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          if ((half::_toFloat[phVar5[uVar8 * 4 + -1]._h].f !=
               half::_toFloat[*(ushort *)(lVar7 + -2 + uVar8 * 8)].f) ||
             (NAN(half::_toFloat[phVar5[uVar8 * 4 + -1]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(lVar7 + -2 + uVar8 * 8)].f))) {
            __assert_fail("p1.b == p2.b",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                          ,0xa6,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          if ((half::_toFloat[phVar5[uVar8 * 4]._h].f !=
               half::_toFloat[*(ushort *)(lVar7 + uVar8 * 8)].f) ||
             (NAN(half::_toFloat[phVar5[uVar8 * 4]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(lVar7 + uVar8 * 8)].f))) {
            __assert_fail("p1.a == p2.a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                          ,0xa7,
                          "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          uVar8 = uVar8 + 1;
        } while ((yStride & 0xffffffff) != uVar8);
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + yStride * 8;
      phVar5 = phVar5 + pixels1._sizeY * 4;
    } while (uVar10 != uVar9);
  }
  remove(name);
  operator_delete__(pvVar4);
  if (pixels1._data != (Rgba *)0x0) {
    operator_delete__(pixels1._data);
  }
  return;
}

Assistant:

void
writeReadYa (Box2i &dw,
	     int tileSizeX,
	     int tileSizeY,
	     const char fileName[],
	     void (* fillPixels) (Array2D<Rgba> &pixels, int w, int h))
{
    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    Array2D <Rgba> pixels1 (h, w);
    Array2D <Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
	TiledRgbaOutputFile out (fileName,
				 tileSizeX, tileSizeY,
				 ONE_LEVEL, ROUND_DOWN,
				 dw, dw,
				 WRITE_YA);

	out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles() - 1,  0, out.numYTiles() - 1);
    }

    cout << "reading " << flush;

    {
	TiledRgbaInputFile in (fileName);

	in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    const Rgba &p1 = pixels1[y][x];
	    const Rgba &p2 = pixels2[y][x];

	    assert (p1.r == p2.r);
	    assert (p1.g == p2.g);
	    assert (p1.b == p2.b);
	    assert (p1.a == p2.a);
	}
    }

    remove (fileName);
}